

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O1

uint64_t __thiscall
axl::sl::
BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
::find(BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,_axl::sl::BoyerMooreSkipTablesBase<char>,_false,_256UL>_>
       *this,BoyerMooreStateBase<char> *state,C *p,size_t length)

{
  size_t sVar1;
  size_t i;
  uint64_t uVar2;
  ulong length_00;
  BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_> accessor;
  BoyerMooreIncrementalAccessorBase<char,_false,_axl::sl::BoyerMooreStateBase<char>_> local_38;
  
  length_00 = (state->m_tail).m_length + length;
  local_38.m_state = state;
  local_38.m_p = p;
  i = BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
      ::
      findImpl<axl::sl::BoyerMooreIncrementalAccessorBase<char,false,axl::sl::BoyerMooreStateBase<char>>>
                ((BoyerMooreFindBase<axl::sl::BoyerMooreDetailsBase<char,axl::sl::BoyerMooreSkipTablesBase<char>,false,256ul>>
                  *)this,&local_38,0,length_00);
  sVar1 = (this->m_pattern).super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
  if (length_00 < i + sVar1) {
    BoyerMooreStateBase<char>::advance<false>(state,i,p,length);
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = state->m_offset + i;
    state->m_offset = sVar1 + uVar2;
    (state->m_tail).m_front = 0;
    (state->m_tail).m_back = 0;
    (state->m_tail).m_length = 0;
  }
  return uVar2;
}

Assistant:

uint64_t
	find(
		BoyerMooreStateBase<C>* state,
		const C* p,
		size_t length
	) const {
		ASSERT(state->getPatternLength() == m_pattern.getCount());

		BoyerMooreIncrementalAccessorBase<C, IsReverse> accessor(state, IsReverse ? p + length - 1 : p);
		size_t fullLength = state->getTailLength() + length;
		size_t i = findImpl(accessor, 0, fullLength);
		if (i + m_pattern.getCount() <= fullLength) {
			uint64_t offset = state->getOffset() + i;
			state->reset(offset + m_pattern.getCount());
			return offset;
		}

		state->template advance<IsReverse>(i, p, length);
		return -1;
	}